

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  CppStringType CVar3;
  RepeatedFieldAccessor *pRVar4;
  undefined1 *puVar5;
  LogMessage LStack_18;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x1d1,"field->is_repeated()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>()::
              singleton;
    break;
  case 2:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    break;
  case 3:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    break;
  case 4:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    break;
  case 5:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    break;
  case 6:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    break;
  case 7:
    pRVar4 = (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    break;
  case 9:
    CVar3 = FieldDescriptor::cpp_string_type(field);
    if (CVar3 == kView) {
      return (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    }
    if (CVar3 == kString) {
      return (RepeatedFieldAccessor *)
             &protobuf::(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    }
    if (CVar3 == kCord) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
                 ,0x1e2);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_18,(char (*) [34])"Repeated cords are not supported.");
      goto LAB_00395866;
    }
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x1ef);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_18,(char (*) [23])"Should not reach here.");
LAB_00395866:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_18);
  case 10:
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      pRVar4 = (RepeatedFieldAccessor *)
               &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton;
      if (protobuf::(anonymous_namespace)::
          GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton != '\0') {
        return pRVar4;
      }
      iVar2 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
                                   singleton);
      if (iVar2 == 0) {
        return pRVar4;
      }
      puVar5 = &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton;
    }
    else {
      pRVar4 = (RepeatedFieldAccessor *)
               &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
      if (protobuf::(anonymous_namespace)::
          GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton !=
          '\0') {
        return pRVar4;
      }
      iVar2 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()
                                   ::singleton);
      if (iVar2 == 0) {
        return pRVar4;
      }
      puVar5 = &protobuf::(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
    }
    __cxa_guard_release(puVar5);
  }
  return pRVar4;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  ABSL_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32_t)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t)
    HANDLE_PRIMITIVE_TYPE(INT64, int64_t)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32_t)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          ABSL_LOG(FATAL) << "Repeated cords are not supported.";
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  ABSL_LOG(FATAL) << "Should not reach here.";
  return nullptr;
}